

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::csharp::GetReflectionClassName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  FileDescriptor *extraout_RDX;
  FileDescriptor *extraout_RDX_00;
  FileDescriptor *descriptor_00;
  AlphaNum *in_R8;
  string result;
  string local_e8;
  string local_c8;
  AlphaNum local_a8;
  undefined8 local_78;
  char *local_70;
  AlphaNum local_48;
  
  GetFileNamespace_abi_cxx11_(&local_e8,this,descriptor);
  if (local_e8._M_string_length == 0) {
    local_e8._M_string_length = 0;
    descriptor_00 = extraout_RDX;
  }
  else {
    std::__cxx11::string::push_back((char)&local_e8);
    descriptor_00 = extraout_RDX_00;
  }
  local_78 = 8;
  local_70 = "global::";
  local_a8.piece_._M_str = local_e8._M_dataplus._M_p;
  local_a8.piece_._M_len = local_e8._M_string_length;
  GetReflectionClassUnqualifiedName_abi_cxx11_(&local_c8,this,descriptor_00);
  local_48.piece_._M_len = local_c8._M_string_length;
  local_48.piece_._M_str = local_c8._M_dataplus._M_p;
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_78,&local_a8,&local_48,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetReflectionClassName(const FileDescriptor* descriptor) {
  std::string result = GetFileNamespace(descriptor);
  if (!result.empty()) {
    result += '.';
  }
  return absl::StrCat("global::", result,
                      GetReflectionClassUnqualifiedName(descriptor));
}